

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

double __thiscall
baryonyx::itm::quadratic_cost_type<double>::operator()
          (quadratic_cost_type<double> *this,int index,bit_array *x)

{
  int iVar1;
  int iVar2;
  type pdVar3;
  type piVar4;
  type pqVar5;
  int local_2c;
  int last;
  int first;
  double ret;
  bit_array *x_local;
  int index_local;
  quadratic_cost_type<double> *this_local;
  
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     (&this->linear_elements,(long)index);
  _last = *pdVar3;
  piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)index);
  local_2c = *piVar4;
  piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)(index + 1));
  iVar1 = *piVar4;
  for (; local_2c != iVar1; local_2c = local_2c + 1) {
    pqVar5 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)local_2c);
    iVar2 = bit_array::operator[](x,pqVar5->id);
    if (iVar2 != 0) {
      pqVar5 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_2c);
      _last = pqVar5->factor + _last;
    }
  }
  return _last;
}

Assistant:

Float operator()(int index, const bit_array& x) const noexcept
    {
        Float ret = linear_elements[index];

        auto first = indices[index];
        auto last = indices[index + 1];

        for (; first != last; ++first)
            if (x[quadratic_elements[first].id])
                ret += quadratic_elements[first].factor;

        return ret;
    }